

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

void __thiscall
v_hashmap<substring,_unsigned_long>::put_after_get_nogrow
          (v_hashmap<substring,_unsigned_long> *this,substring *key,uint64_t hash,unsigned_long *val
          )

{
  substring *psVar1;
  char *pcVar2;
  
  (this->dat)._begin[this->last_position].occupied = true;
  pcVar2 = key->end;
  psVar1 = &(this->dat)._begin[this->last_position].key;
  psVar1->begin = key->begin;
  psVar1->end = pcVar2;
  (this->dat)._begin[this->last_position].val = *val;
  (this->dat)._begin[this->last_position].hash = hash;
  return;
}

Assistant:

T& operator[](size_t i) const { return _begin[i]; }